

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenGlobalInitializer::InitializeCustomTargets(cmQtAutoGenGlobalInitializer *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  cmQtAutoGenGlobalInitializer *pcVar4;
  cmQtAutoGenGlobalInitializer *pcVar5;
  cmQtAutoGenGlobalInitializer *pcVar6;
  cmQtAutoGenGlobalInitializer *this_00;
  pointer puVar7;
  string comment;
  undefined1 local_48 [32];
  
  pcVar5 = (cmQtAutoGenGlobalInitializer *)local_48;
  this_00 = (cmQtAutoGenGlobalInitializer *)local_48;
  puVar1 = (pointer)(local_48 + 0x10);
  local_48._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Global AUTOGEN target","");
  pcVar4 = (cmQtAutoGenGlobalInitializer *)
           (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pcVar6 = pcVar4,
        pcVar6 != (cmQtAutoGenGlobalInitializer *)
                  &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header) {
    GetOrCreateGlobalTarget
              (pcVar5,*(cmLocalGenerator **)
                       &(pcVar6->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header
               ,(string *)
                &(pcVar6->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent,(string *)local_48);
    pcVar4 = (cmQtAutoGenGlobalInitializer *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar6);
    pcVar5 = pcVar6;
  }
  if ((pointer)local_48._0_8_ != puVar1) {
    operator_delete((void *)local_48._0_8_,
                    (ulong)((long)&(((pointer)local_48._16_8_)->_M_t).
                                   super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                                   .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>.
                                   _M_head_impl + 1));
  }
  local_48._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Global AUTORCC target","");
  pcVar5 = (cmQtAutoGenGlobalInitializer *)
           (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pcVar4 = pcVar5,
        pcVar4 != (cmQtAutoGenGlobalInitializer *)
                  &(this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header) {
    GetOrCreateGlobalTarget
              (this_00,*(cmLocalGenerator **)
                        &(pcVar4->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header.
                         _M_header,
               (string *)
               &(pcVar4->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent,(string *)local_48);
    pcVar5 = (cmQtAutoGenGlobalInitializer *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar4);
    this_00 = pcVar4;
  }
  if ((pointer)local_48._0_8_ != puVar1) {
    operator_delete((void *)local_48._0_8_,
                    (ulong)((long)&(((pointer)local_48._16_8_)->_M_t).
                                   super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                                   .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>.
                                   _M_head_impl + 1));
  }
  puVar1 = (this->Initializers_).
           super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->Initializers_).
           super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    bVar3 = true;
  }
  else {
    do {
      puVar7 = puVar1 + 1;
      bVar3 = cmQtAutoGenInitializer::InitCustomTargets
                        ((puVar1->_M_t).
                         super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                         .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl);
      if (!bVar3) {
        return bVar3;
      }
      puVar1 = puVar7;
    } while (puVar7 != puVar2);
  }
  return bVar3;
}

Assistant:

bool cmQtAutoGenGlobalInitializer::InitializeCustomTargets()
{
  // Initialize global autogen targets
  {
    std::string const comment = "Global AUTOGEN target";
    for (auto const& pair : this->GlobalAutoGenTargets_) {
      this->GetOrCreateGlobalTarget(pair.first, pair.second, comment);
    }
  }
  // Initialize global autorcc targets
  {
    std::string const comment = "Global AUTORCC target";
    for (auto const& pair : this->GlobalAutoRccTargets_) {
      this->GetOrCreateGlobalTarget(pair.first, pair.second, comment);
    }
  }
  // Initialize per target autogen targets
  for (auto& initializer : this->Initializers_) {
    if (!initializer->InitCustomTargets()) {
      return false;
    }
  }
  return true;
}